

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O3

int32_t __thiscall
icu_63::RuleBasedBreakIterator::getRuleStatusVec
          (RuleBasedBreakIterator *this,int32_t *fillInVec,int32_t capacity,UErrorCode *status)

{
  int32_t *piVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar2 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    piVar1 = this->fData->fRuleStatusTable;
    uVar2 = piVar1[this->fRuleStatusIndex];
    uVar4 = uVar2;
    if (capacity < (int)uVar2) {
      *status = U_BUFFER_OVERFLOW_ERROR;
      uVar4 = capacity;
    }
    if (0 < (int)uVar4) {
      uVar3 = 0;
      do {
        fillInVec[uVar3] = piVar1[(long)this->fRuleStatusIndex + uVar3 + 1];
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  return uVar2;
}

Assistant:

int32_t RuleBasedBreakIterator::getRuleStatusVec(
             int32_t *fillInVec, int32_t capacity, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return 0;
    }

    int32_t  numVals = fData->fRuleStatusTable[fRuleStatusIndex];
    int32_t  numValsToCopy = numVals;
    if (numVals > capacity) {
        status = U_BUFFER_OVERFLOW_ERROR;
        numValsToCopy = capacity;
    }
    int i;
    for (i=0; i<numValsToCopy; i++) {
        fillInVec[i] = fData->fRuleStatusTable[fRuleStatusIndex + i + 1];
    }
    return numVals;
}